

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

CVmGramProdState *
CVmGramProdState::alloc
          (CVmGramProdMem *mem,int tok_pos,int alt_pos,CVmGramProdState *enclosing,
          vmgram_alt_info *altp,vm_obj_id_t prod_obj,int circular_alt)

{
  CVmGramProdState *pCVar1;
  
  pCVar1 = (CVmGramProdState *)CVmGramProdMem::alloc(mem,altp->tok_cnt * 8 + 0x40);
  pCVar1->tok_pos_ = (long)tok_pos;
  pCVar1->alt_pos_ = (long)alt_pos;
  pCVar1->matched_star_ = 0;
  pCVar1->enclosing_ = enclosing;
  pCVar1->altp_ = altp;
  pCVar1->prod_obj_ = prod_obj;
  pCVar1->circular_alt_ = circular_alt;
  pCVar1->sub_target_prop_ = 0;
  pCVar1->nxt_ = (CVmGramProdState *)0x0;
  return pCVar1;
}

Assistant:

static CVmGramProdState *alloc(CVmGramProdMem *mem,
                                   int tok_pos, int alt_pos,
                                   CVmGramProdState *enclosing,
                                   const vmgram_alt_info *altp,
                                   vm_obj_id_t prod_obj,
                                   int circular_alt)
    {
        size_t match_cnt;
        CVmGramProdState *state;

        /* get the number of match list slots we'll need */
        match_cnt = altp->tok_cnt;

        /* allocate space, including space for the match list */
        state = (CVmGramProdState *)
                mem->alloc(sizeof(CVmGramProdState)
                           + (match_cnt - 1)*sizeof(CVmGramProdMatch *));

        /* initialize */
        state->init(tok_pos, alt_pos, enclosing, altp, prod_obj,
                    circular_alt);

        /* return the new item */
        return state;
    }